

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

uint uv__utf8_decode1(char **p,char *pe)

{
  byte *pbVar1;
  uint a;
  char *pe_local;
  char **p_local;
  
  pbVar1 = (byte *)*p;
  *p = (char *)(pbVar1 + 1);
  p_local._4_4_ = (uint)*pbVar1;
  if (0x7f < p_local._4_4_) {
    p_local._4_4_ = uv__utf8_decode1_slow(p,pe,p_local._4_4_);
  }
  return p_local._4_4_;
}

Assistant:

unsigned uv__utf8_decode1(const char** p, const char* pe) {
  unsigned a;

  a = (unsigned char) *(*p)++;

  if (a < 128)
    return a;  /* ASCII, common case. */

  return uv__utf8_decode1_slow(p, pe, a);
}